

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

void clear_codec_data(MQTTCODEC_INSTANCE *codec_data)

{
  MQTTCODEC_INSTANCE *codec_data_local;
  
  codec_data->currPacket = UNKNOWN_TYPE;
  codec_data->codecState = CODEC_STATE_FIXED_HEADER;
  codec_data->headerFlags = 0;
  codec_data->bufferOffset = 0;
  codec_data->headerData = (BUFFER_HANDLE)0x0;
  memset(codec_data->storeRemainLen,0,4);
  codec_data->remainLenIndex = 0;
  return;
}

Assistant:

static void clear_codec_data(MQTTCODEC_INSTANCE* codec_data)
{
    // Clear the code instance data
    codec_data->currPacket = UNKNOWN_TYPE;
    codec_data->codecState = CODEC_STATE_FIXED_HEADER;
    codec_data->headerFlags = 0;
    codec_data->bufferOffset = 0;
    codec_data->headerData = NULL;
    memset(codec_data->storeRemainLen, 0, 4 * sizeof(uint8_t));
    codec_data->remainLenIndex = 0;
}